

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetas(AsciiParser *this)

{
  bool bVar1;
  uint64_t uVar2;
  char local_19;
  AsciiParser *pAStack_18;
  char c;
  AsciiParser *this_local;
  
  pAStack_18 = this;
  bVar1 = Expect(this,'(');
  if ((bVar1) && (bVar1 = SkipCommentAndWhitespaceAndNewline(this,true), bVar1)) {
    do {
      bVar1 = Eof(this);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return true;
      }
      bVar1 = LookChar1(this,&local_19);
      if (!bVar1) {
        return false;
      }
      if (local_19 == ')') {
        uVar2 = CurrLoc(this);
        bVar1 = SeekTo(this,uVar2 + 1);
        if (!bVar1) {
          return false;
        }
        bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (bVar1) {
          return true;
        }
        return false;
      }
      bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
      if (!bVar1) {
        return false;
      }
      bVar1 = ParseStageMetaOpt(this);
      if (!bVar1) {
        return false;
      }
      bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool AsciiParser::ParseStageMetas() {
  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == ')') {
      if (!SeekTo(CurrLoc() + 1)) {
        return false;
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Stage metas end");

      // end
      return true;

    } else {
      if (!SkipCommentAndWhitespaceAndNewline()) {
        // eof
        return false;
      }

      if (!ParseStageMetaOpt()) {
        // parse error
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }
  }

  DCOUT("ParseStageMetas end");
  return true;
}